

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

double Js::JavascriptConversion::ToInteger(double val)

{
  bool bVar1;
  double dVar2;
  ulong in_XMM0_Qb;
  undefined1 auVar3 [16];
  
  bVar1 = NumberUtilities::IsNan(val);
  dVar2 = 0.0;
  if (((val != 0.0 && !bVar1) &&
      (bVar1 = NumberUtilities::IsSpecial(val,0x7ff0000000000000), dVar2 = val, !bVar1)) &&
     (bVar1 = NumberUtilities::IsSpecial(val,0xfff0000000000000), !bVar1)) {
    auVar3._0_8_ = ABS(val);
    auVar3._8_8_ = in_XMM0_Qb & 0x7fffffffffffffff;
    auVar3 = roundsd(auVar3,auVar3,9);
    dVar2 = (double)(-(ulong)(val < 0.0) & (auVar3._0_8_ ^ 0x8000000000000000) |
                    ~-(ulong)(val < 0.0) & auVar3._0_8_);
  }
  return dVar2;
}

Assistant:

double JavascriptConversion::ToInteger(double val)
    {
        if(JavascriptNumber::IsNan(val) || JavascriptNumber::IsZero(val))
            return 0;
        if(JavascriptNumber::IsPosInf(val) || JavascriptNumber::IsNegInf(val))
        {
            return val;
        }

        return ( ((val < 0) ? -1 : 1 ) * floor(fabs(val)));
    }